

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall rpc_tests::rpc_namedparams::test_method(rpc_namedparams *this)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names_01;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names_02;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names_03;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names_04;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names_05;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names_06;
  long lVar1;
  RPCTestingSetup *pRVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator pvVar4;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  __l;
  const_string file;
  string_view json;
  const_string file_00;
  string_view json_00;
  const_string file_01;
  const_string file_02;
  string_view json_01;
  const_string file_03;
  string_view json_02;
  const_string file_04;
  const_string file_05;
  string_view json_03;
  const_string file_06;
  const_string file_07;
  string_view json_04;
  const_string file_08;
  string_view json_05;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff9dc;
  undefined4 uVar6;
  undefined8 in_stack_fffffffffffff9e0;
  char *pcVar7;
  pointer in_stack_fffffffffffff9e8;
  char *pcVar8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_608;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_5c0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_518;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_480;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_448;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_3a0;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_368;
  char *local_350;
  char *local_348;
  undefined **local_340;
  undefined1 local_338;
  undefined1 *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  allocator_type local_2fb;
  bool local_2fa;
  bool local_2f9;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names;
  UniValue local_2c0;
  UniValue local_248;
  UniValue local_1d0;
  UniValue local_178;
  undefined1 local_120 [32];
  undefined1 local_100 [40];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_60;
  _Base_ptr local_38;
  
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  local_178.typ._0_1_ = 0;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
              *)local_100,(char (*) [5])"arg1",(bool *)&local_178);
  local_340 = (undefined **)((ulong)local_340 & 0xffffffffffffff00);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>(&local_d8,(char (*) [5])"arg2",(bool *)&local_340);
  local_120[0] = false;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>(&local_b0,(char (*) [5])"arg3",(bool *)local_120);
  local_2f9 = false;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>(&local_88,(char (*) [5])"arg4",&local_2f9);
  local_2fa = false;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[5],_bool,_true>(&local_60,(char (*) [5])"arg5",&local_2fa);
  __l._M_len = 5;
  __l._M_array = (iterator)local_100;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&arg_names,__l,&local_2fb);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)(local_100 + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x5c;
  file.m_begin = (iterator)&local_310;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_320,msg);
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_01139f30;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328 = "";
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_348 = "";
  json._M_str = "{\"arg2\": 2, \"arg4\": 4}";
  json._M_len = 0x16;
  JSON(&local_178,json);
  pRVar2 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_368,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar2);
  arg_names_00.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff9dc;
  arg_names_00.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff9d8;
  arg_names_00.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff9e0;
  arg_names_00.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff9e8;
  RPCTestingSetup::TransformParams((UniValue *)local_100,pRVar2,&local_178,arg_names_00);
  UniValue::write_abi_cxx11_((UniValue *)local_120,(int)local_100,(void *)0x0,0);
  pcVar8 = "\"[null,2,null,4]\"";
  pcVar7 = "[null,2,null,4]";
  uVar5 = 0xbbb4cd;
  uVar6 = 0;
  pvVar3 = (iterator)0x2;
  pvVar4 = local_120;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[16]>
            (&local_340,&local_350,0x5c,1);
  std::__cxx11::string::~string((string *)local_120);
  UniValue::~UniValue((UniValue *)local_100);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_368);
  UniValue::~UniValue(&local_178);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x60;
  file_00.m_begin = (iterator)&local_378;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_388,
             msg_00);
  json_00._M_str = "{\"arg2\": 2, \"arg2\": 4}";
  json_00._M_len = 0x16;
  JSON((UniValue *)local_100,json_00);
  pRVar2 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_3a0,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar2);
  arg_names_01.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar6;
  arg_names_01.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar5;
  arg_names_01.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar7;
  arg_names_01.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pcVar8;
  RPCTestingSetup::TransformParams(&local_1d0,pRVar2,(UniValue *)local_100,arg_names_01);
  UniValue::~UniValue(&local_1d0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_3a0);
  UniValue::~UniValue((UniValue *)local_100);
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0x60;
  file_01.m_begin = (iterator)&local_3b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3c0,
             msg_01);
  local_178.typ._0_1_ = 0;
  local_178.val._M_dataplus._M_p = (pointer)0x0;
  local_178.val._M_string_length = 0;
  local_100[8] = '\0';
  local_100._0_8_ = &PTR__lazy_ostream_0113b0d0;
  local_100._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_100._24_8_ = "exception UniValue expected but not raised";
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3c8 = "";
  uVar5 = 0;
  uVar6 = 0;
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_100,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_3d0,0x60);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.val._M_string_length);
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x63;
  file_02.m_begin = (iterator)&local_410;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_420,
             msg_02);
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_01139f30;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328 = "";
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_428 = "";
  json_01._M_str = "{\"arg5\": 5, \"args\": [1, 2], \"arg4\": 4}";
  json_01._M_len = 0x26;
  JSON(&local_178,json_01);
  pRVar2 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_448,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar2);
  arg_names_02.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar6;
  arg_names_02.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar5;
  arg_names_02.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar7;
  arg_names_02.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pcVar8;
  RPCTestingSetup::TransformParams((UniValue *)local_100,pRVar2,&local_178,arg_names_02);
  UniValue::write_abi_cxx11_((UniValue *)local_120,(int)local_100,(void *)0x0,0);
  pcVar8 = "\"[1,2,null,4,5]\"";
  pcVar7 = "[1,2,null,4,5]";
  uVar5 = 0xbbb68c;
  uVar6 = 0;
  pvVar3 = (iterator)0x2;
  pvVar4 = local_120;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
            (&local_340,&local_430,99,1);
  std::__cxx11::string::~string((string *)local_120);
  UniValue::~UniValue((UniValue *)local_100);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_448);
  UniValue::~UniValue(&local_178);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  file_03.m_end = (iterator)0x67;
  file_03.m_begin = (iterator)&local_458;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_468,
             msg_03);
  json_02._M_str = "{\"arg2\": 2, \"unknown\": 6}";
  json_02._M_len = 0x19;
  JSON((UniValue *)local_100,json_02);
  pRVar2 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_480,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar2);
  arg_names_03.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar6;
  arg_names_03.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar5;
  arg_names_03.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar7;
  arg_names_03.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pcVar8;
  RPCTestingSetup::TransformParams(&local_248,pRVar2,(UniValue *)local_100,arg_names_03);
  UniValue::~UniValue(&local_248);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_480);
  UniValue::~UniValue((UniValue *)local_100);
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  file_04.m_end = (iterator)0x67;
  file_04.m_begin = (iterator)&local_490;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_4a0,
             msg_04);
  local_178.typ._0_1_ = 0;
  local_178.val._M_dataplus._M_p = (pointer)0x0;
  local_178.val._M_string_length = 0;
  local_100[8] = '\0';
  local_100._0_8_ = &PTR__lazy_ostream_0113b0d0;
  local_100._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_100._24_8_ = "exception UniValue expected but not raised";
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4a8 = "";
  uVar5 = 0;
  uVar6 = 0;
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_100,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_4b0,0x67);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.val._M_string_length);
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar4;
  file_05.m_end = (iterator)0x6b;
  file_05.m_begin = (iterator)&local_4f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_500,
             msg_05);
  json_03._M_str = "{\"args\": [1,2,3], \"arg4\": 4, \"arg2\": 2}";
  json_03._M_len = 0x27;
  JSON((UniValue *)local_100,json_03);
  pRVar2 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_518,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar2);
  arg_names_04.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar6;
  arg_names_04.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar5;
  arg_names_04.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar7;
  arg_names_04.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pcVar8;
  RPCTestingSetup::TransformParams(&local_2c0,pRVar2,(UniValue *)local_100,arg_names_04);
  UniValue::~UniValue(&local_2c0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_518);
  UniValue::~UniValue((UniValue *)local_100);
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar4;
  file_06.m_end = (iterator)0x6b;
  file_06.m_begin = (iterator)&local_528;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_538,
             msg_06);
  local_178.typ._0_1_ = 0;
  local_178.val._M_dataplus._M_p = (pointer)0x0;
  local_178.val._M_string_length = 0;
  local_100[8] = '\0';
  local_100._0_8_ = &PTR__lazy_ostream_0113b0d0;
  local_100._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_100._24_8_ = "exception UniValue expected but not raised";
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_540 = "";
  uVar5 = 0;
  uVar6 = 0;
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_100,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_548,0x6b);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.val._M_string_length);
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar4;
  file_07.m_end = (iterator)0x6e;
  file_07.m_begin = (iterator)&local_588;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_598,
             msg_07);
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_01139f30;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328 = "";
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5a0 = "";
  json_04._M_str = "{\"args\": [1,2,3,4,5,6,7,8,9,10]}";
  json_04._M_len = 0x20;
  JSON(&local_178,json_04);
  pRVar2 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_5c0,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar2);
  arg_names_05.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar6;
  arg_names_05.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar5;
  arg_names_05.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar7;
  arg_names_05.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pcVar8;
  RPCTestingSetup::TransformParams((UniValue *)local_100,pRVar2,&local_178,arg_names_05);
  UniValue::write_abi_cxx11_((UniValue *)local_120,(int)local_100,(void *)0x0,0);
  pcVar8 = "\"[1,2,3,4,5,6,7,8,9,10]\"";
  pcVar7 = "[1,2,3,4,5,6,7,8,9,10]";
  uVar5 = 0xbbb96b;
  uVar6 = 0;
  pvVar3 = (iterator)0x2;
  pvVar4 = local_120;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[23]>
            (&local_340,&local_5a8,0x6e,1);
  std::__cxx11::string::~string((string *)local_120);
  UniValue::~UniValue((UniValue *)local_100);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_5c0);
  UniValue::~UniValue(&local_178);
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  file_08.m_end = (iterator)0x6f;
  file_08.m_begin = (iterator)&local_5d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_5e0,
             msg_08);
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_01139f30;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328 = "";
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5e8 = "";
  json_05._M_str = "[1,2,3,4,5,6,7,8,9,10]";
  json_05._M_len = 0x16;
  JSON(&local_178,json_05);
  pRVar2 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_608,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar2);
  arg_names_06.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar6;
  arg_names_06.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar5;
  arg_names_06.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar7;
  arg_names_06.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pcVar8;
  RPCTestingSetup::TransformParams((UniValue *)local_100,pRVar2,&local_178,arg_names_06);
  UniValue::write_abi_cxx11_((UniValue *)local_120,(int)local_100,(void *)0x0,0);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[23]>
            (&local_340,&local_5f0,0x6f,1,2,local_120,0xbbb9eb,"[1,2,3,4,5,6,7,8,9,10]",
             "\"[1,2,3,4,5,6,7,8,9,10]\"");
  std::__cxx11::string::~string((string *)local_120);
  UniValue::~UniValue((UniValue *)local_100);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_608);
  UniValue::~UniValue(&local_178);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&arg_names);
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_namedparams)
{
    const std::vector<std::pair<std::string, bool>> arg_names{{"arg1", false}, {"arg2", false}, {"arg3", false}, {"arg4", false}, {"arg5", false}};

    // Make sure named arguments are transformed into positional arguments in correct places separated by nulls
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"arg2": 2, "arg4": 4})"), arg_names).write(), "[null,2,null,4]");

    // Make sure named argument specified multiple times raises an exception
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"arg2": 2, "arg2": 4})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Parameter arg2 specified multiple times"})"));

    // Make sure named and positional arguments can be combined.
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"arg5": 5, "args": [1, 2], "arg4": 4})"), arg_names).write(), "[1,2,null,4,5]");

    // Make sure a unknown named argument raises an exception
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"arg2": 2, "unknown": 6})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Unknown named parameter unknown"})"));

    // Make sure an overlap between a named argument and positional argument raises an exception
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"args": [1,2,3], "arg4": 4, "arg2": 2})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Parameter arg2 specified twice both as positional and named argument"})"));

    // Make sure extra positional arguments can be passed through to the method implementation, as long as they don't overlap with named arguments.
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"args": [1,2,3,4,5,6,7,8,9,10]})"), arg_names).write(), "[1,2,3,4,5,6,7,8,9,10]");
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"([1,2,3,4,5,6,7,8,9,10])"), arg_names).write(), "[1,2,3,4,5,6,7,8,9,10]");
}